

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_symbols.hpp
# Opt level: O0

Elf_Xword __thiscall
ELFIO::symbol_section_accessor_template<ELFIO::section>::
generic_arrange_local_symbols<ELFIO::Elf32_Sym>
          (symbol_section_accessor_template<ELFIO::section> *this,
          function<void_(unsigned_long,_unsigned_long)> *func)

{
  byte bVar1;
  bool bVar2;
  Elf_Xword EVar3;
  Elf32_Sym *local_48;
  Elf32_Sym *p2;
  Elf32_Sym *p1;
  Elf_Xword count;
  Elf_Xword current;
  endianness_convertor *peStack_20;
  Elf_Word first_not_local;
  endianness_convertor *convertor;
  function<void_(unsigned_long,_unsigned_long)> *func_local;
  symbol_section_accessor_template<ELFIO::section> *this_local;
  
  convertor = (endianness_convertor *)func;
  func_local = (function<void_(unsigned_long,_unsigned_long)> *)this;
  peStack_20 = elfio::get_convertor(this->elf_file);
  current._4_4_ = 1;
  EVar3 = get_symbols_num(this);
  do {
    p2 = (Elf32_Sym *)0x0;
    local_48 = (Elf32_Sym *)0x0;
    for (; current._4_4_ < EVar3; current._4_4_ = current._4_4_ + 1) {
      p2 = generic_get_symbol_ptr<ELFIO::Elf32_Sym>(this,(ulong)current._4_4_);
      bVar1 = endianness_convertor::operator()(peStack_20,p2->st_info);
      if ((int)(uint)bVar1 >> 4 != 0) break;
    }
    for (count = (Elf_Xword)(current._4_4_ + 1); count < EVar3; count = count + 1) {
      local_48 = generic_get_symbol_ptr<ELFIO::Elf32_Sym>(this,count);
      bVar1 = endianness_convertor::operator()(peStack_20,local_48->st_info);
      if ((int)(uint)bVar1 >> 4 == 0) break;
    }
    if ((EVar3 <= current._4_4_) || (EVar3 <= count)) {
      (*this->symbol_section->_vptr_section[10])(this->symbol_section,(long)&current + 4);
      return (ulong)current._4_4_;
    }
    bVar2 = std::function::operator_cast_to_bool((function *)func);
    if (bVar2) {
      std::function<void_(unsigned_long,_unsigned_long)>::operator()
                (func,(ulong)current._4_4_,count);
    }
    std::swap<ELFIO::Elf32_Sym>(p2,local_48);
  } while( true );
}

Assistant:

Elf_Xword generic_arrange_local_symbols(
        std::function<void( Elf_Xword first, Elf_Xword second )> func )
    {
        const endianness_convertor& convertor = elf_file.get_convertor();

        Elf_Word first_not_local =
            1; // Skip the first entry. It is always NOTYPE
        Elf_Xword current = 0;
        Elf_Xword count   = get_symbols_num();

        while ( true ) {
            T* p1 = nullptr;
            T* p2 = nullptr;

            while ( first_not_local < count ) {
                p1 = const_cast<T*>(
                    generic_get_symbol_ptr<T>( first_not_local ) );
                if ( ELF_ST_BIND( convertor( p1->st_info ) ) != STB_LOCAL )
                    break;
                ++first_not_local;
            }

            current = first_not_local + 1;
            while ( current < count ) {
                p2 = const_cast<T*>( generic_get_symbol_ptr<T>( current ) );
                if ( ELF_ST_BIND( convertor( p2->st_info ) ) == STB_LOCAL )
                    break;
                ++current;
            }

            if ( first_not_local < count && current < count ) {
                if ( func )
                    func( first_not_local, current );

                std::swap( *p1, *p2 );
            }
            else {
                // Update 'info' field of the section
                symbol_section->set_info( first_not_local );
                break;
            }
        }

        return first_not_local;
    }